

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O1

void __thiscall amrex::FABio_8bit::skip(FABio_8bit *this,istream *is,FArrayBox *f,int nCompToSkip)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  istream *piVar8;
  int iVar9;
  int nbytes;
  Real mx;
  Real mn;
  int local_44 [5];
  
  if (0 < nCompToSkip) {
    iVar1 = (f->super_BaseFab<double>).domain.bigend.vect[0];
    iVar2 = (f->super_BaseFab<double>).domain.bigend.vect[1];
    iVar3 = (f->super_BaseFab<double>).domain.smallend.vect[0];
    iVar4 = (f->super_BaseFab<double>).domain.smallend.vect[1];
    iVar5 = (f->super_BaseFab<double>).domain.bigend.vect[2];
    iVar6 = (f->super_BaseFab<double>).domain.smallend.vect[2];
    iVar9 = 0;
    do {
      piVar8 = std::istream::_M_extract<double>((double *)is);
      piVar8 = std::istream::_M_extract<double>((double *)piVar8);
      std::istream::operator>>((istream *)piVar8,local_44);
      do {
        iVar7 = std::istream::get();
      } while (iVar7 != 10);
      std::istream::seekg((long)is,((iVar5 - iVar6) + 1) *
                                   ((iVar2 - iVar4) + 1) * ((iVar1 - iVar3) + 1));
      iVar9 = iVar9 + 1;
    } while (iVar9 != nCompToSkip);
  }
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    Error_host("FABio_8bit::skip() failed");
  }
  return;
}

Assistant:

void
FABio_8bit::skip (std::istream& is,
                  FArrayBox&    f,
                  int           nCompToSkip) const
{
    const Box& bx = f.box();
    Long siz      = bx.numPts();
    Real mn, mx;
    for(int nbytes, k = 0; k < nCompToSkip; ++k) {
        is >> mn >> mx >> nbytes;
        BL_ASSERT(nbytes == siz);
        while(is.get() != '\n') {
            ;  // ---- do nothing
        }
        is.seekg(siz, std::ios::cur);
    }

    if(is.fail()) {
        amrex::Error("FABio_8bit::skip() failed");
    }
}